

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.h
# Opt level: O0

Vec3 __thiscall CheckerTexture::GetValue(CheckerTexture *this,float u,float v,Vec3 *pos)

{
  undefined8 in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  undefined4 in_XMM0_Da;
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  undefined8 extraout_XMM0_Qa;
  float in_XMM1_Da;
  Vec3 VVar5;
  float _sines;
  Vec3 _pos;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  float in_stack_ffffffffffffff9c;
  Vec3 local_2c;
  undefined8 local_20;
  float local_18;
  undefined4 local_14;
  
  local_20 = in_RDX;
  local_18 = in_XMM1_Da;
  local_14 = in_XMM0_Da;
  operator*(in_stack_ffffffffffffff9c,
            (Vec3 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  fVar1 = Vec3::x(&local_2c);
  dVar3 = std::sin((double)(ulong)(uint)fVar1);
  fVar1 = SUB84(dVar3,0);
  fVar2 = Vec3::y(&local_2c);
  dVar3 = std::sin((double)(ulong)(uint)fVar2);
  fVar2 = Vec3::z(&local_2c);
  dVar4 = std::sin((double)(ulong)(uint)fVar2);
  if (fVar1 * SUB84(dVar3,0) * SUB84(dVar4,0) <= 0.0) {
    (**(code **)(**(long **)(in_RSI + 0x10) + 0x10))
              (local_14,in_RDI,*(long **)(in_RSI + 0x10),local_20);
    fVar1 = local_18;
  }
  else {
    (**(code **)(**(long **)(in_RSI + 8) + 0x10))(local_14,in_RDI,*(long **)(in_RSI + 8),local_20);
    fVar1 = local_18;
  }
  Vec3::~Vec3(&local_2c);
  VVar5.e[2] = fVar1;
  VVar5.e[0] = (float)(int)extraout_XMM0_Qa;
  VVar5.e[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vec3)VVar5.e;
}

Assistant:

virtual Vec3 GetValue(float u, float v, const Vec3& pos) const override {
		
		Vec3   _pos   = 10.0f*pos;
		float  _sines = std::sin(_pos.x()) * std::sin(_pos.y()) * std::sin(_pos.z());
		
		return _sines > 0.0f ? m_odd->GetValue(u, v, pos) : m_even->GetValue(u, v, pos);
	}